

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.cpp
# Opt level: O0

value * stdlib::subtract(vector<parser::thing_*,_std::allocator<parser::thing_*>_> *args,context *c)

{
  code *pcVar1;
  type tVar2;
  ulong uVar3;
  size_type sVar4;
  reference pptVar5;
  reference ppvVar6;
  number *this;
  double dVar7;
  allocator local_b1;
  string local_b0 [32];
  number *local_90;
  number *n;
  string local_80 [36];
  int local_5c;
  double dStack_58;
  int i_1;
  double total;
  value *local_40;
  int local_34;
  undefined1 local_30 [4];
  int i;
  vector<eval::value_*,_std::allocator<eval::value_*>_> e_args;
  context *c_local;
  vector<parser::thing_*,_std::allocator<parser::thing_*>_> *args_local;
  
  e_args.super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)c;
  std::vector<eval::value_*,_std::allocator<eval::value_*>_>::vector
            ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_30);
  local_34 = 1;
  while( true ) {
    uVar3 = (ulong)local_34;
    sVar4 = std::vector<parser::thing_*,_std::allocator<parser::thing_*>_>::size(args);
    if (sVar4 <= uVar3) break;
    pptVar5 = std::vector<parser::thing_*,_std::allocator<parser::thing_*>_>::operator[]
                        (args,(long)local_34);
    local_40 = eval::eval(*pptVar5,(context *)
                                   e_args.
                                   super__Vector_base<eval::value_*,_std::allocator<eval::value_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<eval::value_*,_std::allocator<eval::value_*>_>::push_back
              ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_30,&local_40);
    local_34 = local_34 + 1;
  }
  ppvVar6 = std::vector<eval::value_*,_std::allocator<eval::value_*>_>::operator[]
                      ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_30,0);
  tVar2 = eval::value::get_type(*ppvVar6);
  if (tVar2 == NUMBER) {
    ppvVar6 = std::vector<eval::value_*,_std::allocator<eval::value_*>_>::operator[]
                        ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_30,0);
    dStack_58 = eval::number::get_val((number *)*ppvVar6);
    local_5c = 1;
    while( true ) {
      uVar3 = (ulong)local_5c;
      sVar4 = std::vector<eval::value_*,_std::allocator<eval::value_*>_>::size
                        ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_30);
      if (sVar4 <= uVar3) break;
      ppvVar6 = std::vector<eval::value_*,_std::allocator<eval::value_*>_>::operator[]
                          ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_30,
                           (long)local_5c);
      tVar2 = eval::value::get_type(*ppvVar6);
      if (tVar2 != NUMBER) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_80,"ALL ARGUMENTS TO subtract MUST BE NUMBERS",(allocator *)((long)&n + 7))
        ;
        exit((int)local_80);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)((long)&n + 7));
      }
      ppvVar6 = std::vector<eval::value_*,_std::allocator<eval::value_*>_>::operator[]
                          ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_30,
                           (long)local_5c);
      local_90 = (number *)*ppvVar6;
      dVar7 = eval::number::get_val(local_90);
      dStack_58 = dStack_58 - dVar7;
      local_5c = local_5c + 1;
    }
    this = (number *)operator_new(0x18);
    eval::number::number(this,dStack_58);
    std::vector<eval::value_*,_std::allocator<eval::value_*>_>::~vector
              ((vector<eval::value_*,_std::allocator<eval::value_*>_> *)local_30);
    return &this->super_value;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"SUBTRACT ONLY WORKS WITH NUMBERS.",&local_b1);
  exit((int)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

eval::value *stdlib::subtract(std::vector<parser::thing *> args, context &c) {

  std::vector<eval::value *> e_args;
  for (int i = 1; i < args.size(); i++) {
    e_args.push_back(eval::eval(args[i], c));
  }

  if (e_args[0]->get_type()==eval::type::NUMBER) {

    double total = (static_cast<eval::number *>(e_args[0]))->get_val();

    for (int i = 1; i < e_args.size(); i++) {

      if (e_args[i]->get_type()!=eval::type::NUMBER)
        stdlib::exit("ALL ARGUMENTS TO subtract MUST BE NUMBERS");

      eval::number *n = static_cast<eval::number *>(e_args[i]);
      total -= n->get_val();

    }

    return new eval::number(total);
  }

  stdlib::exit("SUBTRACT ONLY WORKS WITH NUMBERS.");

}